

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

int pbrt::NextPrime(int x)

{
  initializer_list<int> __l;
  bool bVar1;
  uint in_EDI;
  value_type_conflict1 *__x;
  int n;
  int maxPrimeGap;
  anon_class_8_1_d89be81b isPrime;
  vector<int,_std::allocator<int>_> smallPrimes;
  vector<int,_std::allocator<int>_> *this;
  int iVar2;
  int iVar3;
  allocator_type *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  undefined1 *puVar5;
  uint local_8;
  uint local_4;
  
  if (in_EDI == 2) {
    local_4 = 3;
  }
  else {
    local_8 = in_EDI;
    if ((in_EDI & 1) == 0) {
      local_8 = in_EDI + 1;
    }
    uVar4 = 2;
    puVar5 = &stack0xffffffffffffffcc;
    this = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffcb;
    std::allocator<int>::allocator((allocator<int> *)0x5974ed);
    __l._M_array._4_4_ = uVar4;
    __l._M_array._0_4_ = in_stack_ffffffffffffffc8;
    __l._M_len = (size_type)puVar5;
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffffc0,__l,in_stack_ffffffffffffffb8);
    std::allocator<int>::~allocator((allocator<int> *)0x597512);
    uVar4 = 0x140;
    iVar2 = 3;
    while (iVar3 = iVar2, __x = (value_type_conflict1 *)std::sqrt<int>(0),
          iVar2 < (int)(double)__x + 1) {
      bVar1 = NextPrime::anon_class_8_1_d89be81b::operator()
                        ((anon_class_8_1_d89be81b *)CONCAT44(uVar4,iVar3),(int)((ulong)this >> 0x20)
                        );
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::push_back(this,__x);
      }
      iVar2 = iVar3 + 2;
    }
    while (bVar1 = NextPrime::anon_class_8_1_d89be81b::operator()
                             ((anon_class_8_1_d89be81b *)CONCAT44(uVar4,iVar3),
                              (int)((ulong)this >> 0x20)), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_8 = local_8 + 2;
    }
    local_4 = local_8;
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return local_4;
}

Assistant:

int NextPrime(int x) {
    if (x == 2)
        return 3;
    if ((x & 1) == 0)
        ++x;  // make it odd

    std::vector<int> smallPrimes{2};
    // NOTE: isPrime w.r.t. smallPrims...
    auto isPrime = [&smallPrimes](int n) {
        for (int p : smallPrimes)
            if (n != p && (n % p) == 0)
                return false;
        return true;
    };

    // Initialize smallPrimes
    // Up to about 2B, the biggest gap between primes:
    // https://en.wikipedia.org/wiki/Prime_gap
    const int maxPrimeGap = 320;
    for (int n = 3; n < int(std::sqrt(x + maxPrimeGap)) + 1; n += 2)
        if (isPrime(n))
            smallPrimes.push_back(n);

    while (!isPrime(x))
        x += 2;

    return x;
}